

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * operator*(Matrix4f *x,Matrix4f *y)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Matrix4f *in_RDX;
  Matrix4f *in_RSI;
  Matrix4f *in_RDI;
  int k;
  int j;
  int i;
  Matrix4f *product;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  Matrix4f::Matrix4f(in_RDI,0.0);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        pfVar4 = Matrix4f::operator()(in_RSI,local_1c,local_20);
        fVar1 = *pfVar4;
        pfVar4 = Matrix4f::operator()(in_RDX,local_20,local_24);
        fVar2 = *pfVar4;
        pfVar4 = Matrix4f::operator()(in_RDI,local_1c,local_24);
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
        *pfVar4 = auVar3._0_4_;
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix4f operator * ( const Matrix4f& x, const Matrix4f& y )
{
	Matrix4f product; // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			for( int k = 0; k < 4; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}